

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_hash_table.hpp
# Opt level: O0

void __thiscall
poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>::set_quo_
          (compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *this,
          uint64_t slot_id,uint64_t quo)

{
  uint64_t in_RSI;
  compact_vector *in_RDI;
  uint64_t in_stack_00000010;
  uint64_t in_stack_00000018;
  
  compact_vector::get(in_RDI,in_RSI);
  compact_vector::set((compact_vector *)quo,in_stack_00000018,in_stack_00000010);
  return;
}

Assistant:

void set_quo_(uint64_t slot_id, uint64_t quo) {
        assert(quo < quo_size_.size());
        table_.set(slot_id, (table_.get(slot_id) & quo_invmask_) | (quo << quo_shift_));
    }